

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_L_invmult_inplace_p(m256v *LU,int rank,m256v *X_inout,int *placements)

{
  long in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int pj;
  int j;
  int pi;
  int i;
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  int iVar3;
  int r1;
  int iVar4;
  int iVar5;
  int local_24;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    r1 = local_24;
    if (in_RCX != 0) {
      r1 = *(int *)(in_RCX + (long)local_24 * 4);
    }
    for (iVar5 = 0; iVar5 < local_24; iVar5 = iVar5 + 1) {
      iVar2 = iVar5;
      if (in_RCX != 0) {
        iVar2 = *(int *)(in_RCX + (long)iVar5 * 4);
      }
      uVar1 = in_RDX;
      iVar3 = iVar2;
      iVar4 = iVar2;
      m256v_get_el((m256v *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),(int)((ulong)in_RDX >> 0x20),
                   (int)in_RDX);
      m256v_multadd_row((m256v *)CONCAT44(iVar5,iVar4),r1,(uint8_t)((uint)iVar3 >> 0x18),
                        (m256v *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                        (int)((ulong)uVar1 >> 0x20));
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply L^(-1) */
	for (int i = 0; i < rank; ++i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = 0; j < i; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
					MV_GEN_N(_get_el)(LU, i, j),
					X_inout, pi);
		}
	}
}